

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool __thiscall OpenCLEnum::Device::printInfo(Device *this)

{
  undefined1 local_128 [8];
  DeviceInfo device_info;
  Device *this_local;
  
  device_info.extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  ocl::DeviceInfo::DeviceInfo((DeviceInfo *)local_128);
  ocl::DeviceInfo::init((DeviceInfo *)local_128,(EVP_PKEY_CTX *)this->id);
  ocl::DeviceInfo::print((DeviceInfo *)local_128);
  ocl::DeviceInfo::~DeviceInfo((DeviceInfo *)local_128);
  return true;
}

Assistant:

bool OpenCLEnum::Device::printInfo() const
{
	ocl::DeviceInfo device_info;
	device_info.init(id);
	device_info.print();
	return true;
}